

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-avl.c
# Opt level: O1

void pp_tree_avl_rotate_right(PTreeAVLNode *node,PTreeBaseNode **root)

{
  int iVar1;
  PTreeBaseNode_ *pPVar2;
  PTreeAVLNode_ *pPVar3;
  PTreeAVLNode_ *pPVar4;
  
  pPVar2 = (node->base).right;
  pPVar3 = node->parent;
  (pPVar3->base).left = pPVar2;
  if (pPVar2 != (PTreeBaseNode_ *)0x0) {
    pPVar2[1].left = &pPVar3->base;
  }
  pPVar3 = node->parent;
  (node->base).right = &pPVar3->base;
  node->parent = pPVar3->parent;
  pPVar3->parent = node;
  pPVar4 = node->parent;
  if (pPVar4 != (PTreeAVLNode_ *)0x0) {
    root = &(pPVar4->base).left + ((PTreeAVLNode_ *)(pPVar4->base).left != pPVar3);
  }
  *root = &node->base;
  iVar1 = node->balance_factor;
  node->balance_factor = iVar1 + -1;
  *(int *)&(node->base).right[1].right = 1 - iVar1;
  return;
}

Assistant:

static void
pp_tree_avl_rotate_right (PTreeAVLNode *node, PTreeBaseNode **root)
{
	node->parent->base.left = node->base.right;

	if (node->base.right != NULL)
		((PTreeAVLNode *) node->base.right)->parent = (PTreeAVLNode *) node->parent;

	node->base.right = (PTreeBaseNode *) node->parent;
	node->parent = ((PTreeAVLNode *) node->base.right)->parent;
	((PTreeAVLNode *) node->base.right)->parent = node;

	if (P_LIKELY (node->parent != NULL)) {
		if (node->parent->base.left == node->base.right)
			node->parent->base.left = (PTreeBaseNode *) node;
		else
			node->parent->base.right = (PTreeBaseNode *) node;
	} else
		*root = (PTreeBaseNode *) node;

	/* Restore balance factor */
	((PTreeAVLNode *) node)->balance_factor -= 1;
	((PTreeAVLNode *) node->base.right)->balance_factor = -((PTreeAVLNode *) node)->balance_factor;
}